

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O1

bool __thiscall flatbuffers::jsons::JsonSchemaGenerator::generate(JsonSchemaGenerator *this)

{
  BaseType BVar1;
  FieldDef *pFVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  EnumDef *pEVar6;
  Parser *pPVar7;
  size_type *psVar8;
  ulong *puVar9;
  BaseType extraout_EDX;
  BaseType extraout_EDX_00;
  BaseType extraout_EDX_01;
  BaseType extraout_EDX_02;
  BaseType extraout_EDX_03;
  BaseType BVar10;
  pointer ppEVar11;
  string *psVar12;
  _Alloc_hider _Var13;
  pointer ppEVar14;
  pointer ppFVar15;
  int iVar16;
  char *pcVar17;
  ulong uVar18;
  undefined8 uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  StructDef *pSVar21;
  char *pcVar22;
  bool bVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enumdef;
  string comment;
  string arrayInfo;
  string typeLine;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> requiredProperties;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  string local_1f8;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  long lStack_1c0;
  string local_1b8;
  string local_190;
  string *local_170;
  ulong *local_168;
  long local_160;
  ulong local_158;
  long lStack_150;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  pointer local_128;
  long *local_120;
  undefined8 local_118;
  long local_110;
  undefined8 uStack_108;
  StructDef *local_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  string local_98;
  string local_78;
  long *local_58 [2];
  long local_48 [2];
  StructDef *local_38;
  
  psVar12 = &this->code_;
  pcVar22 = "";
  std::__cxx11::string::_M_replace((ulong)psVar12,0,(char *)(this->code_)._M_string_length,0x374d53)
  ;
  pPVar7 = (this->super_BaseGenerator).parser_;
  pSVar21 = pPVar7->root_struct_def_;
  if (pSVar21 == (StructDef *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: Binary schema not generated, no root struct found\n",
               0x39);
    goto LAB_002dcca3;
  }
  bVar23 = -1 < (pPVar7->opts).indent_step;
  pcVar17 = "";
  if (bVar23) {
    pcVar17 = "\n";
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,pcVar17,pcVar17 + bVar23);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x37c617);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258.field_2._8_8_ = plVar4[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_258._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_170 = psVar12;
  std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
  iVar16 = 0;
  if (0 < iVar3) {
    iVar16 = iVar3;
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar16);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
  paVar20 = &local_278.field_2;
  puVar9 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278.field_2._8_8_ = plVar4[3];
    local_278._M_dataplus._M_p = (pointer)paVar20;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_278._M_string_length = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
  pcVar17 = "";
  if (bVar23) {
    pcVar17 = "\n";
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar17,pcVar17 + bVar23);
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar20) {
    uVar19 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_218._M_string_length + local_278._M_string_length) {
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      uVar19 = local_218.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_218._M_string_length + local_278._M_string_length) goto LAB_002d86c3;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_218,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
  }
  else {
LAB_002d86c3:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_218._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258.field_2._8_8_ = puVar5[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_258._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  std::__cxx11::string::_M_append((char *)local_170,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar20) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
  iVar16 = 0;
  if (0 < iVar3) {
    iVar16 = iVar3;
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar16);
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
  paVar20 = &local_278.field_2;
  puVar9 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278.field_2._8_8_ = puVar5[3];
    local_278._M_dataplus._M_p = (pointer)paVar20;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_278._M_string_length = puVar5[1];
  *puVar5 = puVar9;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
  if (bVar23) {
    pcVar22 = "\n";
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar22,pcVar22 + bVar23);
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar20) {
    uVar19 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_218._M_string_length + local_278._M_string_length) {
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      uVar19 = local_218.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_218._M_string_length + local_278._M_string_length) goto LAB_002d889c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_218,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
  }
  else {
LAB_002d889c:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_218._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258.field_2._8_8_ = puVar5[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_258._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  std::__cxx11::string::_M_append((char *)local_170,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar20) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  psVar12 = local_170;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  pPVar7 = (this->super_BaseGenerator).parser_;
  ppEVar14 = (pPVar7->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_38 = pSVar21;
  if (ppEVar14 !=
      (pPVar7->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar3 = (pPVar7->opts).indent_step;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)iVar3 * '\x02');
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_218.field_2._M_allocated_capacity = *puVar9;
        local_218.field_2._8_8_ = plVar4[3];
      }
      else {
        local_218.field_2._M_allocated_capacity = *puVar9;
        local_218._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_218._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      anon_unknown_1::GenFullName<flatbuffers::EnumDef>(&local_1b8,*ppEVar14);
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar19 = local_218.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1b8._M_string_length + local_218._M_string_length) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          uVar19 = local_1b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_1b8._M_string_length + local_218._M_string_length)
        goto LAB_002d8aa2;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_002d8aa2:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_218,(ulong)local_1b8._M_dataplus._M_p);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_238.field_2._M_allocated_capacity = *psVar8;
        local_238.field_2._8_8_ = puVar5[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar8;
        local_238._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_238._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)psVar8 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278.field_2._8_8_ = plVar4[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_278._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar22 = "";
      if (bVar23) {
        pcVar22 = "\n";
      }
      local_1d8 = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar22,pcVar22 + bVar23)
      ;
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        uVar19 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1d0 + local_278._M_string_length) {
        uVar18 = 0xf;
        if (local_1d8 != &local_1c8) {
          uVar18 = local_1c8;
        }
        if (uVar18 < local_1d0 + local_278._M_string_length) goto LAB_002d8bf6;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002d8bf6:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258.field_2._8_8_ = puVar5[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_258._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)psVar8 = 0;
      std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_218,(char)iVar3 * '\x03');
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"string","");
      anon_unknown_1::GenType(&local_1f8,&local_1b8);
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar19 = local_218.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1f8._M_string_length + local_218._M_string_length) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar19 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_1f8._M_string_length + local_218._M_string_length)
        goto LAB_002d8e12;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_002d8e12:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_218,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_238.field_2._M_allocated_capacity = *psVar8;
        local_238.field_2._8_8_ = puVar5[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar8;
        local_238._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_238._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)psVar8 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278.field_2._8_8_ = plVar4[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_278._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar22 = "";
      if (bVar23) {
        pcVar22 = "\n";
      }
      local_1d8 = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar22,pcVar22 + bVar23)
      ;
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        uVar19 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1d0 + local_278._M_string_length) {
        uVar18 = 0xf;
        if (local_1d8 != &local_1c8) {
          uVar18 = local_1c8;
        }
        if (uVar18 < local_1d0 + local_278._M_string_length) goto LAB_002d8f66;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002d8f66:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258.field_2._8_8_ = puVar5[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_258._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)psVar8 = 0;
      std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_278,(char)iVar3 * '\x03');
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258.field_2._8_8_ = puVar5[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_258._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      pEVar6 = *ppEVar14;
      for (ppEVar11 = (pEVar6->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppEVar11 !=
          (pEVar6->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar11 = ppEVar11 + 1) {
        std::operator+(&local_238,"\"",&(*ppEVar11)->name);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        puVar9 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_278.field_2._M_allocated_capacity = *puVar9;
          local_278.field_2._8_8_ = plVar4[3];
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar9;
          local_278._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_278._M_string_length = plVar4[1];
        *plVar4 = (long)puVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_278._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if (*ppEVar11 !=
            ((*ppEVar14)->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1]) {
          std::__cxx11::string::append((char *)&local_258);
        }
        pEVar6 = *ppEVar14;
      }
      std::__cxx11::string::append((char *)&local_258);
      bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar22 = "";
      if (bVar23) {
        pcVar22 = "\n";
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,pcVar22,pcVar22 + bVar23)
      ;
      psVar12 = local_170;
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_238,0,(char *)0x0,(ulong)local_258._M_dataplus._M_p)
      ;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_278.field_2._M_allocated_capacity = *psVar8;
        local_278.field_2._8_8_ = plVar4[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar8;
        local_278._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_278._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_218,(char)iVar3 * '\x02');
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_218);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_238.field_2._M_allocated_capacity = *puVar9;
        local_238.field_2._8_8_ = plVar4[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *puVar9;
        local_238._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_238._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar22 = "";
      if (bVar23) {
        pcVar22 = "\n";
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar22,pcVar22 + bVar23)
      ;
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        uVar19 = local_238.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1f8._M_string_length + local_238._M_string_length) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar19 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_1f8._M_string_length + local_238._M_string_length)
        goto LAB_002d9460;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_238._M_dataplus._M_p);
      }
      else {
LAB_002d9460:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_238,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      puVar9 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278.field_2._8_8_ = puVar5[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_278._M_string_length = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)puVar9 = 0;
      std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      ppEVar14 = ppEVar14 + 1;
      pPVar7 = (this->super_BaseGenerator).parser_;
    } while (ppEVar14 !=
             (pPVar7->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_128 = (pPVar7->structs_).vec.
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pPVar7 = (this->super_BaseGenerator).parser_;
  if (local_128 !=
      (pPVar7->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      paVar20 = &local_278.field_2;
      iVar3 = (pPVar7->opts).indent_step;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)iVar3 * '\x02');
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_218.field_2._M_allocated_capacity = *puVar9;
        local_218.field_2._8_8_ = plVar4[3];
      }
      else {
        local_218.field_2._M_allocated_capacity = *puVar9;
        local_218._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_218._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      anon_unknown_1::GenFullName<flatbuffers::StructDef>(&local_1b8,*local_128);
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar19 = local_218.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1b8._M_string_length + local_218._M_string_length) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          uVar19 = local_1b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_1b8._M_string_length + local_218._M_string_length)
        goto LAB_002d96ad;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_002d96ad:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_218,(ulong)local_1b8._M_dataplus._M_p);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_238.field_2._M_allocated_capacity = *psVar8;
        local_238.field_2._8_8_ = puVar5[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar8;
        local_238._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_238._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)psVar8 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278.field_2._8_8_ = plVar4[3];
        local_278._M_dataplus._M_p = (pointer)paVar20;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_278._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar22 = "";
      if (bVar23) {
        pcVar22 = "\n";
      }
      local_1d8 = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar22,pcVar22 + bVar23)
      ;
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        uVar19 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1d0 + local_278._M_string_length) {
        uVar18 = 0xf;
        if (local_1d8 != &local_1c8) {
          uVar18 = local_1c8;
        }
        if (uVar18 < local_1d0 + local_278._M_string_length) goto LAB_002d97f0;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002d97f0:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258.field_2._8_8_ = puVar5[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_258._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)psVar8 = 0;
      std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_218,(char)iVar3 * '\x03');
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"object","");
      anon_unknown_1::GenType(&local_1f8,&local_1b8);
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar19 = local_218.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1f8._M_string_length + local_218._M_string_length) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar19 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_1f8._M_string_length + local_218._M_string_length)
        goto LAB_002d9a07;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_002d9a07:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_218,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      puVar9 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_238.field_2._M_allocated_capacity = *puVar9;
        local_238.field_2._8_8_ = puVar5[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *puVar9;
        local_238._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_238._M_string_length = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)puVar9 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278.field_2._8_8_ = plVar4[3];
        local_278._M_dataplus._M_p = (pointer)paVar20;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_278._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar22 = "";
      if (bVar23) {
        pcVar22 = "\n";
      }
      local_1d8 = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar22,pcVar22 + bVar23)
      ;
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        uVar19 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1d0 + local_278._M_string_length) {
        uVar18 = 0xf;
        if (local_1d8 != &local_1c8) {
          uVar18 = local_1c8;
        }
        if (uVar18 < local_1d0 + local_278._M_string_length) goto LAB_002d9b52;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002d9b52:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258.field_2._8_8_ = puVar5[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_258._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)psVar8 = 0;
      std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      PrepareDescription(&local_218,this,&((*local_128)->super_Definition).doc_comment);
      pcVar22 = "";
      iVar3 = std::__cxx11::string::compare((char *)&local_218);
      if (iVar3 != 0) {
        iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)iVar3 * '\x03');
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        puVar9 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_1f8.field_2._M_allocated_capacity = *puVar9;
          local_1f8.field_2._8_8_ = plVar4[3];
        }
        else {
          local_1f8.field_2._M_allocated_capacity = *puVar9;
          local_1f8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_1f8._M_string_length = plVar4[1];
        *plVar4 = (long)puVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1f8,(ulong)local_218._M_dataplus._M_p);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        puVar9 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_238.field_2._M_allocated_capacity = *puVar9;
          local_238.field_2._8_8_ = plVar4[3];
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar9;
          local_238._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_238._M_string_length = plVar4[1];
        *plVar4 = (long)puVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
        puVar9 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_278.field_2._M_allocated_capacity = *puVar9;
          local_278.field_2._8_8_ = plVar4[3];
          local_278._M_dataplus._M_p = (pointer)paVar20;
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar9;
          local_278._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_278._M_string_length = plVar4[1];
        *plVar4 = (long)puVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
        pcVar17 = "";
        if (bVar23) {
          pcVar17 = "\n";
        }
        local_1d8 = &local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,pcVar17,pcVar17 + bVar23);
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar20) {
          uVar19 = local_278.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_1d0 + local_278._M_string_length) {
          uVar18 = 0xf;
          if (local_1d8 != &local_1c8) {
            uVar18 = local_1c8;
          }
          if (uVar18 < local_1d0 + local_278._M_string_length) goto LAB_002d9eac;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
        }
        else {
LAB_002d9eac:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
        }
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        psVar8 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_258.field_2._M_allocated_capacity = *psVar8;
          local_258.field_2._8_8_ = puVar5[3];
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar8;
          local_258._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_258._M_string_length = puVar5[1];
        *puVar5 = psVar8;
        puVar5[1] = 0;
        *(undefined1 *)psVar8 = 0;
        std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_258._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8,local_1c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar20) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
      }
      iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar3 * '\x03');
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
      puVar9 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278.field_2._8_8_ = puVar5[3];
        local_278._M_dataplus._M_p = (pointer)paVar20;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_278._M_string_length = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (bVar23) {
        pcVar22 = "\n";
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar22,pcVar22 + bVar23)
      ;
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        uVar19 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1f8._M_string_length + local_278._M_string_length) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar19 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_1f8._M_string_length + local_278._M_string_length)
        goto LAB_002da0f0;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002da0f0:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_278,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      puVar9 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_258.field_2._M_allocated_capacity = *puVar9;
        local_258.field_2._8_8_ = puVar5[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *puVar9;
        local_258._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_258._M_string_length = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)puVar9 = 0;
      std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_100 = *local_128;
      for (ppFVar15 = (local_100->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; paVar20 = &local_278.field_2,
          ppFVar15 !=
          (local_100->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppFVar15 = ppFVar15 + 1) {
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
        if (((*ppFVar15)->value).type.base_type == BASE_TYPE_ARRAY) {
          bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
          pcVar22 = "";
          if (bVar23) {
            pcVar22 = "\n";
          }
          local_58[0] = local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_58,pcVar22,pcVar22 + bVar23);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x367b70);
          local_148 = &local_138;
          puVar9 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar9) {
            local_138 = *puVar9;
            lStack_130 = plVar4[3];
          }
          else {
            local_138 = *puVar9;
            local_148 = (ulong *)*plVar4;
          }
          local_140 = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct((ulong)&local_b8,(char)(iVar3 << 3));
          uVar18 = 0xf;
          if (local_148 != &local_138) {
            uVar18 = local_138;
          }
          if (uVar18 < (ulong)(local_b0 + local_140)) {
            uVar18 = 0xf;
            if (local_b8 != local_a8) {
              uVar18 = local_a8[0];
            }
            if (uVar18 < (ulong)(local_b0 + local_140)) goto LAB_002da383;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_148);
          }
          else {
LAB_002da383:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_b8);
          }
          local_120 = &local_110;
          plVar4 = puVar5 + 2;
          if ((long *)*puVar5 == plVar4) {
            local_110 = *plVar4;
            uStack_108 = puVar5[3];
          }
          else {
            local_110 = *plVar4;
            local_120 = (long *)*puVar5;
          }
          local_118 = puVar5[1];
          *puVar5 = plVar4;
          puVar5[1] = 0;
          *(undefined1 *)plVar4 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_120);
          local_168 = &local_158;
          puVar9 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar9) {
            local_158 = *puVar9;
            lStack_150 = plVar4[3];
          }
          else {
            local_158 = *puVar9;
            local_168 = (ulong *)*plVar4;
          }
          local_160 = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          NumToString<unsigned_short>(&local_78,((*ppFVar15)->value).type.fixed_length);
          uVar18 = 0xf;
          if (local_168 != &local_158) {
            uVar18 = local_158;
          }
          if (uVar18 < local_78._M_string_length + local_160) {
            uVar19 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              uVar19 = local_78.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar19 < local_78._M_string_length + local_160) goto LAB_002da4e2;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_168);
          }
          else {
LAB_002da4e2:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_168,(ulong)local_78._M_dataplus._M_p);
          }
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          puVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_190.field_2._M_allocated_capacity = *puVar9;
            local_190.field_2._8_8_ = puVar5[3];
          }
          else {
            local_190.field_2._M_allocated_capacity = *puVar9;
            local_190._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_190._M_string_length = puVar5[1];
          *puVar5 = puVar9;
          puVar5[1] = 0;
          *(undefined1 *)puVar9 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_190);
          local_1d8 = &local_1c8;
          puVar9 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar9) {
            local_1c8 = *puVar9;
            lStack_1c0 = plVar4[3];
          }
          else {
            local_1c8 = *puVar9;
            local_1d8 = (ulong *)*plVar4;
          }
          local_1d0 = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
          pcVar22 = "";
          if (bVar23) {
            pcVar22 = "\n";
          }
          local_d8 = local_c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,pcVar22,pcVar22 + bVar23);
          uVar18 = 0xf;
          if (local_1d8 != &local_1c8) {
            uVar18 = local_1c8;
          }
          if (uVar18 < (ulong)(local_d0 + local_1d0)) {
            uVar18 = 0xf;
            if (local_d8 != local_c8) {
              uVar18 = local_c8[0];
            }
            if (uVar18 < (ulong)(local_d0 + local_1d0)) goto LAB_002da664;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_1d8);
          }
          else {
LAB_002da664:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_d8);
          }
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          puVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_1b8.field_2._M_allocated_capacity = *puVar9;
            local_1b8.field_2._8_8_ = puVar5[3];
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *puVar9;
            local_1b8._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_1b8._M_string_length = puVar5[1];
          *puVar5 = puVar9;
          puVar5[1] = 0;
          *(undefined1 *)puVar9 = 0;
          iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          local_f8 = local_e8;
          std::__cxx11::string::_M_construct((ulong)&local_f8,(char)(iVar3 << 3));
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            uVar19 = local_1b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < local_f0 + local_1b8._M_string_length) {
            uVar18 = 0xf;
            if (local_f8 != local_e8) {
              uVar18 = local_e8[0];
            }
            if (uVar18 < local_f0 + local_1b8._M_string_length) goto LAB_002da77b;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_f8,0,(char *)0x0,(ulong)local_1b8._M_dataplus._M_p);
          }
          else {
LAB_002da77b:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_f8);
          }
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          puVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_238.field_2._M_allocated_capacity = *puVar9;
            local_238.field_2._8_8_ = puVar5[3];
          }
          else {
            local_238.field_2._M_allocated_capacity = *puVar9;
            local_238._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_238._M_string_length = puVar5[1];
          *puVar5 = puVar9;
          puVar5[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
          puVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_278.field_2._M_allocated_capacity = *puVar9;
            local_278.field_2._8_8_ = puVar5[3];
            local_278._M_dataplus._M_p = (pointer)paVar20;
          }
          else {
            local_278.field_2._M_allocated_capacity = *puVar9;
            local_278._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_278._M_string_length = puVar5[1];
          *puVar5 = puVar9;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          NumToString<unsigned_short>(&local_98,((*ppFVar15)->value).type.fixed_length);
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar20) {
            uVar19 = local_278.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < local_98._M_string_length + local_278._M_string_length) {
            uVar19 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              uVar19 = local_98.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar19 < local_98._M_string_length + local_278._M_string_length)
            goto LAB_002da8a2;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_98,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
          }
          else {
LAB_002da8a2:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_278,(ulong)local_98._M_dataplus._M_p);
          }
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          puVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_258.field_2._M_allocated_capacity = *puVar9;
            local_258.field_2._8_8_ = puVar5[3];
          }
          else {
            local_258.field_2._M_allocated_capacity = *puVar9;
            local_258._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_258._M_string_length = puVar5[1];
          *puVar5 = puVar9;
          puVar5[1] = 0;
          *(undefined1 *)puVar9 = 0;
          std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar20) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (local_f8 != local_e8) {
            operator_delete(local_f8,local_e8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if (local_d8 != local_c8) {
            operator_delete(local_d8,local_c8[0] + 1);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,local_1c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8,local_a8[0] + 1);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_58[0] != local_48) {
            operator_delete(local_58[0],local_48[0] + 1);
          }
        }
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"");
        if ((*ppFVar15)->deprecated == true) {
          bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
          pcVar22 = "";
          if (bVar23) {
            pcVar22 = "\n";
          }
          local_1d8 = &local_1c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,pcVar22,pcVar22 + bVar23);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x367b70);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          puVar9 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_238.field_2._M_allocated_capacity = *puVar9;
            local_238.field_2._8_8_ = plVar4[3];
          }
          else {
            local_238.field_2._M_allocated_capacity = *puVar9;
            local_238._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_238._M_string_length = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_190,(char)(iVar3 << 3));
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            uVar19 = local_238.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < local_190._M_string_length + local_238._M_string_length) {
            uVar19 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              uVar19 = local_190.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar19 < local_190._M_string_length + local_238._M_string_length)
            goto LAB_002dac8a;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_190,0,(char *)0x0,(ulong)local_238._M_dataplus._M_p);
          }
          else {
LAB_002dac8a:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_238,(ulong)local_190._M_dataplus._M_p);
          }
          puVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_278.field_2._M_allocated_capacity = *puVar9;
            local_278.field_2._8_8_ = puVar5[3];
            local_278._M_dataplus._M_p = (pointer)paVar20;
          }
          else {
            local_278.field_2._M_allocated_capacity = *puVar9;
            local_278._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_278._M_string_length = puVar5[1];
          *puVar5 = puVar9;
          puVar5[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
          puVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_258.field_2._M_allocated_capacity = *puVar9;
            local_258.field_2._8_8_ = puVar5[3];
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          }
          else {
            local_258.field_2._M_allocated_capacity = *puVar9;
            local_258._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_258._M_string_length = puVar5[1];
          *puVar5 = puVar9;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          psVar12 = local_170;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar20) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,local_1c8 + 1);
          }
        }
        iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_238,(char)(iVar3 << 2));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
        psVar8 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_278.field_2._M_allocated_capacity = *psVar8;
          local_278.field_2._8_8_ = plVar4[3];
          local_278._M_dataplus._M_p = (pointer)paVar20;
        }
        else {
          local_278.field_2._M_allocated_capacity = *psVar8;
          local_278._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_278._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_278,
                                    (ulong)((*ppFVar15)->super_Definition).name._M_dataplus._M_p);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_258.field_2._M_allocated_capacity = *psVar8;
          local_258.field_2._8_8_ = plVar4[3];
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar8;
          local_258._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_258._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_258);
        local_1d8 = &local_1c8;
        puVar9 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar9) {
          local_1c8 = *puVar9;
          lStack_1c0 = plVar4[3];
        }
        else {
          local_1c8 = *puVar9;
          local_1d8 = (ulong *)*plVar4;
        }
        local_1d0 = plVar4[1];
        *plVar4 = (long)puVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar20) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
        pcVar22 = "";
        if (bVar23) {
          pcVar22 = "\n";
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,pcVar22,pcVar22 + bVar23);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0x38281c);
        puVar9 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_278.field_2._M_allocated_capacity = *puVar9;
          local_278.field_2._8_8_ = plVar4[3];
          local_278._M_dataplus._M_p = (pointer)paVar20;
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar9;
          local_278._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_278._M_string_length = plVar4[1];
        *plVar4 = (long)puVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_190,(char)(iVar3 << 3));
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar20) {
          uVar19 = local_278.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_190._M_string_length + local_278._M_string_length) {
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            uVar19 = local_190.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < local_190._M_string_length + local_278._M_string_length)
          goto LAB_002db099;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_190,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
        }
        else {
LAB_002db099:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_278,(ulong)local_190._M_dataplus._M_p);
        }
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        puVar9 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_258.field_2._M_allocated_capacity = *puVar9;
          local_258.field_2._8_8_ = puVar5[3];
        }
        else {
          local_258.field_2._M_allocated_capacity = *puVar9;
          local_258._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_258._M_string_length = puVar5[1];
        *puVar5 = puVar9;
        puVar5[1] = 0;
        *(undefined1 *)puVar9 = 0;
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_258._M_dataplus._M_p);
        BVar10 = extraout_EDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          BVar10 = extraout_EDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          BVar10 = extraout_EDX_01;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar20) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          BVar10 = extraout_EDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          BVar10 = extraout_EDX_03;
        }
        pFVar2 = *ppFVar15;
        BVar1 = (pFVar2->value).type.base_type;
        switch(BVar1) {
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_ARRAY:
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          local_258._M_string_length = 0;
          local_258.field_2._M_allocated_capacity =
               local_258.field_2._M_allocated_capacity & 0xffffffffffffff00;
          pSVar21 = (pFVar2->value).type.struct_def;
          if (pSVar21 == (StructDef *)0x0) {
            pEVar6 = (pFVar2->value).type.enum_def;
            if (pEVar6 == (EnumDef *)0x0) {
              (anonymous_namespace)::GenType_abi_cxx11_
                        (&local_278,(_anonymous_namespace_ *)(ulong)(pFVar2->value).type.element,
                         BVar10);
              goto LAB_002db1e8;
            }
            anon_unknown_1::GenTypeRef<flatbuffers::EnumDef>(&local_278,pEVar6);
            std::__cxx11::string::operator=((string *)&local_258,(string *)&local_278);
          }
          else {
            anon_unknown_1::GenTypeRef<flatbuffers::StructDef>(&local_278,pSVar21);
LAB_002db1e8:
            std::__cxx11::string::operator=((string *)&local_258,(string *)&local_278);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar20) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_278,"\"type\" : \"array\", \"items\" : {",&local_258);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          puVar9 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_190.field_2._M_allocated_capacity = *puVar9;
            local_190.field_2._8_8_ = plVar4[3];
          }
          else {
            local_190.field_2._M_allocated_capacity = *puVar9;
            local_190._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_190._M_string_length = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar20) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          break;
        case BASE_TYPE_STRUCT:
          anon_unknown_1::GenTypeRef<flatbuffers::StructDef>
                    (&local_190,(pFVar2->value).type.struct_def);
          break;
        case BASE_TYPE_UNION:
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          local_190.field_2._M_allocated_capacity = 0x3a22664f796e6122;
          local_190._M_string_length = 10;
          local_190.field_2._8_3_ = 0x5b20;
          pEVar6 = (pFVar2->value).type.enum_def;
          for (ppEVar11 = (pEVar6->vals).vec.
                          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              ppEVar11 <
              (pEVar6->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish; ppEVar11 = ppEVar11 + 1) {
            BVar10 = ((*ppEVar11)->union_type).base_type;
            if (BVar10 != BASE_TYPE_NONE) {
              if (BVar10 == BASE_TYPE_STRUCT) {
                anon_unknown_1::GenTypeRef<flatbuffers::StructDef>
                          (&local_238,((*ppEVar11)->union_type).struct_def);
                plVar4 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_238,0,(char *)0x0,0x373089);
                local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                puVar9 = (ulong *)(plVar4 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar4 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar9) {
                  local_278.field_2._M_allocated_capacity = *puVar9;
                  local_278.field_2._8_8_ = plVar4[3];
                }
                else {
                  local_278.field_2._M_allocated_capacity = *puVar9;
                  local_278._M_dataplus._M_p = (pointer)*plVar4;
                }
                local_278._M_string_length = plVar4[1];
                *plVar4 = (long)puVar9;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
                local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                puVar9 = puVar5 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar9) {
                  local_258.field_2._M_allocated_capacity = *puVar9;
                  local_258.field_2._8_8_ = puVar5[3];
                }
                else {
                  local_258.field_2._M_allocated_capacity = *puVar9;
                  local_258._M_dataplus._M_p = (pointer)*puVar5;
                }
                local_258._M_string_length = puVar5[1];
                *puVar5 = puVar9;
                puVar5[1] = 0;
                *(undefined1 *)(puVar5 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&local_190,(ulong)local_258._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                  operator_delete(local_258._M_dataplus._M_p,
                                  local_258.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._M_dataplus._M_p != &local_278.field_2) {
                  operator_delete(local_278._M_dataplus._M_p,
                                  local_278.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != &local_238.field_2) {
                  operator_delete(local_238._M_dataplus._M_p,
                                  local_238.field_2._M_allocated_capacity + 1);
                }
              }
              if (*ppEVar11 !=
                  (((pFVar2->value).type.enum_def)->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]) {
                std::__cxx11::string::append((char *)&local_190);
              }
            }
          }
          std::__cxx11::string::append((char *)&local_190);
          psVar12 = local_170;
          break;
        default:
          if (BVar1 == BASE_TYPE_UTYPE) {
            anon_unknown_1::GenTypeRef<flatbuffers::EnumDef>
                      (&local_190,(pFVar2->value).type.enum_def);
          }
          else {
            pSVar21 = (pFVar2->value).type.struct_def;
            if (pSVar21 == (StructDef *)0x0) {
              pEVar6 = (pFVar2->value).type.enum_def;
              if (pEVar6 == (EnumDef *)0x0) {
                (anonymous_namespace)::GenType_abi_cxx11_
                          (&local_190,(_anonymous_namespace_ *)(ulong)BVar1,BVar10);
              }
              else {
                anon_unknown_1::GenTypeRef<flatbuffers::EnumDef>(&local_190,pEVar6);
              }
            }
            else {
              anon_unknown_1::GenTypeRef<flatbuffers::StructDef>(&local_190,pSVar21);
            }
          }
        }
        paVar20 = &local_278.field_2;
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_190._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1f8._M_dataplus._M_p);
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b8._M_dataplus._M_p);
        PrepareDescription(&local_258,this,&((*ppFVar15)->super_Definition).doc_comment);
        iVar3 = std::__cxx11::string::compare((char *)&local_258);
        if (iVar3 != 0) {
          bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
          pcVar22 = "";
          if (bVar23) {
            pcVar22 = "\n";
          }
          local_120 = &local_110;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,pcVar22,pcVar22 + bVar23);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x367b70);
          local_168 = &local_158;
          puVar9 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar9) {
            local_158 = *puVar9;
            lStack_150 = plVar4[3];
          }
          else {
            local_158 = *puVar9;
            local_168 = (ulong *)*plVar4;
          }
          local_160 = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          local_148 = &local_138;
          std::__cxx11::string::_M_construct((ulong)&local_148,(char)(iVar3 << 3));
          uVar18 = 0xf;
          if (local_168 != &local_158) {
            uVar18 = local_158;
          }
          if (uVar18 < (ulong)(local_140 + local_160)) {
            uVar18 = 0xf;
            if (local_148 != &local_138) {
              uVar18 = local_138;
            }
            if (uVar18 < (ulong)(local_140 + local_160)) goto LAB_002db760;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,(ulong)local_168)
            ;
          }
          else {
LAB_002db760:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_148);
          }
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          puVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_190.field_2._M_allocated_capacity = *puVar9;
            local_190.field_2._8_8_ = puVar5[3];
          }
          else {
            local_190.field_2._M_allocated_capacity = *puVar9;
            local_190._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_190._M_string_length = puVar5[1];
          *puVar5 = puVar9;
          puVar5[1] = 0;
          *(undefined1 *)puVar9 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_190);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          puVar9 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_238.field_2._M_allocated_capacity = *puVar9;
            local_238.field_2._8_8_ = plVar4[3];
          }
          else {
            local_238.field_2._M_allocated_capacity = *puVar9;
            local_238._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_238._M_string_length = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_238,(ulong)local_258._M_dataplus._M_p);
          puVar9 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_278.field_2._M_allocated_capacity = *puVar9;
            local_278.field_2._8_8_ = plVar4[3];
            local_278._M_dataplus._M_p = (pointer)paVar20;
          }
          else {
            local_278.field_2._M_allocated_capacity = *puVar9;
            local_278._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_278._M_string_length = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_278._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar20) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
        }
        pcVar22 = "";
        bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (bVar23) {
          pcVar22 = "\n";
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,pcVar22,pcVar22 + bVar23);
        iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        local_168 = &local_158;
        std::__cxx11::string::_M_construct((ulong)&local_168,(char)iVar3 * '\a');
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          uVar19 = local_190.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_160 + local_190._M_string_length) {
          uVar18 = 0xf;
          if (local_168 != &local_158) {
            uVar18 = local_158;
          }
          if (uVar18 < local_160 + local_190._M_string_length) goto LAB_002dba46;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_168,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
        }
        else {
LAB_002dba46:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_168);
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        puVar9 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_238.field_2._M_allocated_capacity = *puVar9;
          local_238.field_2._8_8_ = puVar5[3];
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar9;
          local_238._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_238._M_string_length = puVar5[1];
        *puVar5 = puVar9;
        puVar5[1] = 0;
        *(undefined1 *)puVar9 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
        psVar8 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_278.field_2._M_allocated_capacity = *psVar8;
          local_278.field_2._8_8_ = plVar4[3];
          local_278._M_dataplus._M_p = (pointer)paVar20;
        }
        else {
          local_278.field_2._M_allocated_capacity = *psVar8;
          local_278._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_278._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_278._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar20) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if (local_168 != &local_158) {
          operator_delete(local_168,local_158 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if (*ppFVar15 !=
            (local_100->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1]) {
          std::__cxx11::string::append((char *)&local_1d8);
        }
        bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
        pcVar22 = "";
        if (bVar23) {
          pcVar22 = "\n";
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,pcVar22,pcVar22 + bVar23);
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_1d8);
        puVar9 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_278.field_2._M_allocated_capacity = *puVar9;
          local_278.field_2._8_8_ = puVar5[3];
          local_278._M_dataplus._M_p = (pointer)paVar20;
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar9;
          local_278._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_278._M_string_length = puVar5[1];
        *puVar5 = puVar9;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_278._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar20) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8,local_1c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
      }
      iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar3 * '\x03');
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278.field_2._8_8_ = plVar4[3];
        local_278._M_dataplus._M_p = (pointer)paVar20;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_278._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar22 = "";
      if (bVar23) {
        pcVar22 = "\n";
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar22,pcVar22 + bVar23)
      ;
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        uVar19 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1f8._M_string_length + local_278._M_string_length) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar19 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_1f8._M_string_length + local_278._M_string_length)
        goto LAB_002dbea2;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002dbea2:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_278,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258.field_2._8_8_ = puVar5[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_258._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)psVar8 = 0;
      std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_1b8._M_dataplus._M_p = (pointer)0x0;
      local_1b8._M_string_length = 0;
      local_1b8.field_2._M_allocated_capacity = 0;
      std::
      copy_if<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef*const*,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,std::back_insert_iterator<std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,flatbuffers::jsons::JsonSchemaGenerator::generate()::_lambda(flatbuffers::FieldDef_const*)_1_>
                ((local_100->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (local_100->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_1b8);
      if (local_1b8._M_dataplus._M_p != (pointer)local_1b8._M_string_length) {
        iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        local_278._M_dataplus._M_p = (pointer)paVar20;
        std::__cxx11::string::_M_construct((ulong)&local_278,(char)iVar3 * '\x03');
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        psVar8 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_258.field_2._M_allocated_capacity = *psVar8;
          local_258.field_2._8_8_ = puVar5[3];
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar8;
          local_258._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_258._M_string_length = puVar5[1];
        *puVar5 = psVar8;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        _Var13._M_p = local_1b8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar20) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          _Var13._M_p = local_1b8._M_dataplus._M_p;
        }
        for (; _Var13._M_p != (pointer)local_1b8._M_string_length;
            _Var13._M_p = (pointer)((long)_Var13._M_p + 8)) {
          std::operator+(&local_238,"\"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          _Var13._M_p);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
          puVar9 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_278.field_2._M_allocated_capacity = *puVar9;
            local_278.field_2._8_8_ = plVar4[3];
            local_278._M_dataplus._M_p = (pointer)paVar20;
          }
          else {
            local_278.field_2._M_allocated_capacity = *puVar9;
            local_278._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_278._M_string_length = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_278._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar20) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (*(size_type *)_Var13._M_p != *(size_type *)(local_1b8._M_string_length + -8)) {
            std::__cxx11::string::append((char *)&local_258);
          }
        }
        std::__cxx11::string::append((char *)&local_258);
        bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
        pcVar22 = "";
        if (bVar23) {
          pcVar22 = "\n";
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,pcVar22,pcVar22 + bVar23);
        psVar12 = local_170;
        plVar4 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_238,0,(char *)0x0,
                                    (ulong)local_258._M_dataplus._M_p);
        puVar9 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_278.field_2._M_allocated_capacity = *puVar9;
          local_278.field_2._8_8_ = plVar4[3];
          local_278._M_dataplus._M_p = (pointer)paVar20;
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar9;
          local_278._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_278._M_string_length = plVar4[1];
        *plVar4 = (long)puVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_278._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar20) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
      }
      iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar3 * '\x03');
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278.field_2._8_8_ = plVar4[3];
        local_278._M_dataplus._M_p = (pointer)paVar20;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_278._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar22 = "";
      if (bVar23) {
        pcVar22 = "\n";
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar22,pcVar22 + bVar23)
      ;
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        uVar19 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_1f8._M_string_length + local_278._M_string_length) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar19 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_1f8._M_string_length + local_278._M_string_length)
        goto LAB_002dc36f;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002dc36f:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_278,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258.field_2._8_8_ = puVar5[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_258._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)psVar8 = 0;
      std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      local_278._M_dataplus._M_p = (pointer)paVar20;
      std::__cxx11::string::_M_construct((ulong)&local_278,(char)iVar3 * '\x02');
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258.field_2._8_8_ = puVar5[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar8;
        local_258._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_258._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (*local_128 !=
          (((this->super_BaseGenerator).parser_)->structs_).vec.
          super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1]) {
        std::__cxx11::string::append((char *)&local_258);
      }
      bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar22 = "";
      if (bVar23) {
        pcVar22 = "\n";
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,pcVar22,pcVar22 + bVar23)
      ;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_238,0,(char *)0x0,(ulong)local_258._M_dataplus._M_p);
      puVar9 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278.field_2._8_8_ = puVar5[3];
        local_278._M_dataplus._M_p = (pointer)paVar20;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_278._M_string_length = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar20) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_1b8._M_dataplus._M_p,
                        local_1b8.field_2._M_allocated_capacity - (long)local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      local_128 = local_128 + 1;
      pPVar7 = (this->super_BaseGenerator).parser_;
    } while (local_128 !=
             (pPVar7->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar22 = "";
  iVar3 = (pPVar7->opts).indent_step;
  iVar16 = 0;
  if (0 < iVar3) {
    iVar16 = iVar3;
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar16);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
  paVar20 = &local_278.field_2;
  puVar9 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278.field_2._8_8_ = plVar4[3];
    local_278._M_dataplus._M_p = (pointer)paVar20;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_278._M_string_length = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
  pcVar17 = "";
  if (bVar23) {
    pcVar17 = "\n";
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar17,pcVar17 + bVar23);
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar20) {
    uVar19 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_218._M_string_length + local_278._M_string_length) {
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      uVar19 = local_218.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_218._M_string_length + local_278._M_string_length) goto LAB_002dc75e;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_218,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
  }
  else {
LAB_002dc75e:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_218._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258.field_2._8_8_ = puVar5[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_258._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  std::__cxx11::string::_M_append((char *)local_170,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar20) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  iVar3 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
  iVar16 = 0;
  if (0 < iVar3) {
    iVar16 = iVar3;
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)iVar16);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  puVar9 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_218.field_2._M_allocated_capacity = *puVar9;
    local_218.field_2._8_8_ = plVar4[3];
  }
  else {
    local_218.field_2._M_allocated_capacity = *puVar9;
    local_218._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_218._M_string_length = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  anon_unknown_1::GenFullName<flatbuffers::StructDef>
            (&local_1b8,((this->super_BaseGenerator).parser_)->root_struct_def_);
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    uVar19 = local_218.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_1b8._M_string_length + local_218._M_string_length) {
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      uVar19 = local_1b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_1b8._M_string_length + local_218._M_string_length) goto LAB_002dc937;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
  }
  else {
LAB_002dc937:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1b8._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_238.field_2._M_allocated_capacity = *psVar8;
    local_238.field_2._8_8_ = puVar5[3];
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar8;
    local_238._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_238._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
  psVar12 = local_170;
  puVar9 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278.field_2._8_8_ = plVar4[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_278._M_string_length = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
  pcVar17 = "";
  if (bVar23) {
    pcVar17 = "\n";
  }
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar17,pcVar17 + bVar23);
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    uVar19 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_1d0 + local_278._M_string_length) {
    uVar18 = 0xf;
    if (local_1d8 != &local_1c8) {
      uVar18 = local_1c8;
    }
    if (uVar18 < local_1d0 + local_278._M_string_length) goto LAB_002dca81;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
  }
  else {
LAB_002dca81:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258.field_2._8_8_ = puVar5[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_258._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,local_1c8 + 1);
  }
  paVar20 = &local_278.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar20) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  bVar23 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
  if (bVar23) {
    pcVar22 = "\n";
  }
  local_278._M_dataplus._M_p = (pointer)paVar20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,pcVar22,pcVar22 + bVar23);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x3785fb);
  pSVar21 = local_38;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258.field_2._8_8_ = plVar4[3];
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar8;
    local_258._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_258._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_170,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar20) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
LAB_002dcca3:
  return pSVar21 != (StructDef *)0x0;
}

Assistant:

bool generate() {
    code_ = "";
    if (parser_.root_struct_def_ == nullptr) {
      std::cerr << "Error: Binary schema not generated, no root struct found\n";
      return false;
    }
    code_ += "{" + NewLine();
    code_ += Indent(1) +
             "\"$schema\": \"https://json-schema.org/draft/2019-09/schema\"," +
             NewLine();
    code_ += Indent(1) + "\"definitions\": {" + NewLine();
    for (auto e = parser_.enums_.vec.cbegin(); e != parser_.enums_.vec.cend();
         ++e) {
      code_ += Indent(2) + "\"" + GenFullName(*e) + "\" : {" + NewLine();
      code_ += Indent(3) + GenType("string") + "," + NewLine();
      auto enumdef(Indent(3) + "\"enum\": [");
      for (auto enum_value = (*e)->Vals().begin();
           enum_value != (*e)->Vals().end(); ++enum_value) {
        enumdef.append("\"" + (*enum_value)->name + "\"");
        if (*enum_value != (*e)->Vals().back()) { enumdef.append(", "); }
      }
      enumdef.append("]");
      code_ += enumdef + NewLine();
      code_ += Indent(2) + "}," + NewLine();  // close type
    }
    for (auto s = parser_.structs_.vec.cbegin();
         s != parser_.structs_.vec.cend(); ++s) {
      const auto &structure = *s;
      code_ += Indent(2) + "\"" + GenFullName(structure) + "\" : {" + NewLine();
      code_ += Indent(3) + GenType("object") + "," + NewLine();
      const auto &comment_lines = structure->doc_comment;
      auto comment = PrepareDescription(comment_lines);
      if (comment != "") {
        code_ += Indent(3) + "\"description\" : " + comment + "," + NewLine();
      }

      code_ += Indent(3) + "\"properties\" : {" + NewLine();

      const auto &properties = structure->fields.vec;
      for (auto prop = properties.cbegin(); prop != properties.cend(); ++prop) {
        const auto &property = *prop;
        std::string arrayInfo = "";
        if (IsArray(property->value.type)) {
          arrayInfo = "," + NewLine() + Indent(8) + "\"minItems\": " +
                      NumToString(property->value.type.fixed_length) + "," +
                      NewLine() + Indent(8) + "\"maxItems\": " +
                      NumToString(property->value.type.fixed_length);
        }
        std::string deprecated_info = "";
        if (property->deprecated) {
          deprecated_info =
              "," + NewLine() + Indent(8) + "\"deprecated\" : true";
        }
        std::string typeLine = Indent(4) + "\"" + property->name + "\"";
        typeLine += " : {" + NewLine() + Indent(8);
        typeLine += GenType(property->value.type);
        typeLine += arrayInfo;
        typeLine += deprecated_info;
        auto description = PrepareDescription(property->doc_comment);
        if (description != "") {
          typeLine +=
              "," + NewLine() + Indent(8) + "\"description\" : " + description;
        }

        typeLine += NewLine() + Indent(7) + "}";
        if (property != properties.back()) { typeLine.append(","); }
        code_ += typeLine + NewLine();
      }
      code_ += Indent(3) + "}," + NewLine();  // close properties

      std::vector<FieldDef *> requiredProperties;
      std::copy_if(properties.begin(), properties.end(),
                   back_inserter(requiredProperties),
                   [](FieldDef const *prop) { return prop->IsRequired(); });
      if (!requiredProperties.empty()) {
        auto required_string(Indent(3) + "\"required\" : [");
        for (auto req_prop = requiredProperties.cbegin();
             req_prop != requiredProperties.cend(); ++req_prop) {
          required_string.append("\"" + (*req_prop)->name + "\"");
          if (*req_prop != requiredProperties.back()) {
            required_string.append(", ");
          }
        }
        required_string.append("],");
        code_ += required_string + NewLine();
      }
      code_ += Indent(3) + "\"additionalProperties\" : false" + NewLine();
      auto closeType(Indent(2) + "}");
      if (*s != parser_.structs_.vec.back()) { closeType.append(","); }
      code_ += closeType + NewLine();  // close type
    }
    code_ += Indent(1) + "}," + NewLine();  // close definitions

    // mark root type
    code_ += Indent(1) + "\"$ref\" : \"#/definitions/" +
             GenFullName(parser_.root_struct_def_) + "\"" + NewLine();

    code_ += "}" + NewLine();  // close schema root
    return true;
  }